

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

void __thiscall
NavierStokesBase::computeNewDt
          (NavierStokesBase *this,int finest_level,int param_2,
          Vector<int,_std::allocator<int>_> *n_cycle,
          Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *param_4,
          Vector<double,_std::allocator<double>_> *dt_min,
          Vector<double,_std::allocator<double>_> *dt_level,Real stop_time,int post_regrid_flag)

{
  ostringstream *this_00;
  ostringstream *poVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pSVar4;
  pointer piVar5;
  vector<int,_std::allocator<int>_> *pvVar6;
  Vector<int,_std::allocator<int>_> *pVVar7;
  TimeCenter TVar8;
  NavierStokesBase *pNVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  double extraout_XMM0_Qa;
  double dVar13;
  Real RVar14;
  double dVar15;
  char local_1d1;
  Vector<int,_std::allocator<int>_> *local_1d0;
  Real local_1c8;
  ulong local_1c0;
  Print local_1b8;
  
  if ((this->super_AmrLevel).level < 1) {
    local_1d0 = n_cycle;
    local_1c8 = stop_time;
    if (-1 < finest_level) {
      uVar12 = 0;
      do {
        pNVar9 = getLevel(this,(int)uVar12);
        pdVar2 = (dt_min->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        (*(pNVar9->super_AmrLevel)._vptr_AmrLevel[0x31])();
        dVar15 = pdVar2[uVar12];
        dVar13 = extraout_XMM0_Qa;
        if (dVar15 <= extraout_XMM0_Qa) {
          dVar13 = dVar15;
        }
        (dt_min->super_vector<double,_std::allocator<double>_>).
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [uVar12] = dVar13;
        uVar12 = uVar12 + 1;
      } while (finest_level + 1 != uVar12);
    }
    if (fixed_dt <= 0.0) {
      if (post_regrid_flag == 1) {
        if (-1 < finest_level) {
          pdVar2 = (dt_min->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3 = (dt_level->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar12 = 0;
          do {
            dVar15 = pdVar3[uVar12];
            dVar13 = pdVar2[uVar12];
            if (dVar13 <= dVar15) {
              dVar15 = dVar13;
            }
            pdVar2[uVar12] = dVar15;
            uVar12 = uVar12 + 1;
          } while (finest_level + 1 != uVar12);
        }
      }
      else if (-1 < finest_level) {
        this_00 = &local_1b8.ss;
        uVar12 = (ulong)(finest_level + 1);
        uVar11 = 0;
        local_1c0 = uVar12;
        do {
          if ((verbose != 0) &&
             (change_max *
              (dt_level->super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar11] <
              (dt_min->super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar11])) {
            local_1b8.os = amrex::OutStream();
            local_1b8.rank = *(int *)(DAT_00756620 + -0x30);
            local_1b8.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
            *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
                 *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"NavierStokesBase::compute_new_dt : limiting dt at level "
                       ,0x38);
            std::ostream::operator<<(this_00,(int)uVar11);
            local_1d1 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,&local_1d1,1);
            amrex::Print::~Print(&local_1b8);
            local_1b8.os = amrex::OutStream();
            local_1b8.rank = *(int *)(DAT_00756620 + -0x30);
            local_1b8.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
            poVar1 = &local_1b8.ss;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
            *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
                 *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," ... new dt computed: ",0x16);
            std::ostream::_M_insert<double>
                      ((dt_min->super_vector<double,_std::allocator<double>_>).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar11]);
            local_1d1 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,&local_1d1,1);
            amrex::Print::~Print(&local_1b8);
            local_1b8.os = amrex::OutStream();
            local_1b8.rank = *(int *)(DAT_00756620 + -0x30);
            local_1b8.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
            poVar1 = &local_1b8.ss;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
            *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
                 *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," ... but limiting to: ",0x16);
            std::ostream::_M_insert<double>
                      (change_max *
                       (dt_level->super_vector<double,_std::allocator<double>_>).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar11]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
            std::ostream::_M_insert<double>(change_max);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," * ",3);
            std::ostream::_M_insert<double>
                      ((dt_level->super_vector<double,_std::allocator<double>_>).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar11]);
            local_1d1 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,&local_1d1,1);
            amrex::Print::~Print(&local_1b8);
            uVar12 = local_1c0;
          }
          pdVar2 = (dt_min->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar13 = change_max *
                   (dt_level->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11];
          dVar15 = pdVar2[uVar11];
          if (dVar15 <= dVar13) {
            dVar13 = dVar15;
          }
          pdVar2[uVar11] = dVar13;
          uVar11 = uVar11 + 1;
        } while (uVar12 != uVar11);
      }
    }
    pVVar7 = local_1d0;
    if (finest_level < 0) {
      local_1d0 = (Vector<int,_std::allocator<int>_> *)0x54b249ad2594c37d;
    }
    else {
      pvVar6 = &local_1d0->super_vector<int,_std::allocator<int>_>;
      local_1d0 = (Vector<int,_std::allocator<int>_> *)0x54b249ad2594c37d;
      iVar10 = 1;
      uVar12 = 0;
      do {
        iVar10 = iVar10 * (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar12];
        dVar15 = (double)iVar10 *
                 (dt_min->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar12];
        if ((double)local_1d0 <= dVar15) {
          dVar15 = (double)local_1d0;
        }
        local_1d0 = (Vector<int,_std::allocator<int>_> *)dVar15;
        uVar12 = uVar12 + 1;
      } while (finest_level + 1 != uVar12);
    }
    pSVar4 = (this->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start;
    TVar8 = amrex::StateDescriptor::timeType(pSVar4->desc);
    if (TVar8 == Point) {
      RVar14 = (pSVar4->new_time).stop;
    }
    else {
      RVar14 = ((pSVar4->new_time).start + (pSVar4->new_time).stop) * 0.5;
    }
    if ((0.0 <= local_1c8) && ((double)local_1d0 * -0.0001 + local_1c8 < (double)local_1d0 + RVar14)
       ) {
      local_1d0 = (Vector<int,_std::allocator<int>_> *)(local_1c8 - RVar14);
    }
    if (-1 < finest_level) {
      piVar5 = (pVVar7->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar2 = (dt_level->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      iVar10 = 1;
      uVar12 = 0;
      do {
        iVar10 = iVar10 * piVar5[uVar12];
        pdVar2[uVar12] = (double)local_1d0 / (double)iVar10;
        uVar12 = uVar12 + 1;
      } while (finest_level + 1 != uVar12);
    }
  }
  return;
}

Assistant:

void
NavierStokesBase::computeNewDt (int                   finest_level,
				int                   /*sub_cycle*/,
				Vector<int>&           n_cycle,
				const Vector<IntVect>& /*ref_ratio*/,
				Vector<Real>&          dt_min,
				Vector<Real>&          dt_level,
				Real                  stop_time,
				int                   post_regrid_flag)
{
    //
    // We are at the start of a coarse grid timecycle.
    // Compute the timesteps for the next iteration.
    //
    if (level > 0)
        return;

    int i;

    Real dt_0     = 1.0e+100;
    int  n_factor = 1;
    for (i = 0; i <= finest_level; i++)
    {
        NavierStokesBase& adv_level = getLevel(i);
        dt_min[i] = std::min(dt_min[i],adv_level.estTimeStep());
    }

    if (fixed_dt <= 0.0)
    {
       if (post_regrid_flag == 1)
       {
          //
          // Limit dt's by pre-regrid dt
          //
          for (i = 0; i <= finest_level; i++)
          {
              dt_min[i] = std::min(dt_min[i],dt_level[i]);
          }
       }
       else
       {
          //
          // Limit dt's by change_max * old dt
          //
          for (i = 0; i <= finest_level; i++)
          {
	    if (verbose)
                 if (dt_min[i] > change_max*dt_level[i])
                 {
                     amrex::Print() << "NavierStokesBase::compute_new_dt : limiting dt at level "
				    << i << '\n';
                     amrex::Print() << " ... new dt computed: " << dt_min[i]
				    << '\n';
                     amrex::Print() << " ... but limiting to: "
				    << change_max * dt_level[i] << " = " << change_max
				    << " * " << dt_level[i] << '\n';
                 }
             dt_min[i] = std::min(dt_min[i],change_max*dt_level[i]);
          }
       }
    }

    //
    // Find the minimum over all levels
    //
    for (i = 0; i <= finest_level; i++)
    {
        n_factor *= n_cycle[i];
        dt_0      = std::min(dt_0,n_factor*dt_min[i]);
    }

    //
    // Limit dt's by the value of stop_time.
    //
    const Real eps      = 0.0001*dt_0;
    const Real cur_time = state[State_Type].curTime();
    if (stop_time >= 0.0)
    {
        if ((cur_time + dt_0) > (stop_time - eps))
            dt_0 = stop_time - cur_time;
    }

    //
    // Set dt at each level of refinement
    //
    n_factor = 1;
    for (i = 0; i <= finest_level; i++)
    {
        n_factor   *= n_cycle[i];
        dt_level[i] = dt_0/( (Real)n_factor );
    }
}